

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::finalizeComplete(Federate *this)

{
  handle asyncInfo;
  handle local_28;
  
  if ((this->singleThreadFederate != true) && ((this->currentMode)._M_i == PENDING_FINALIZE)) {
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (&local_28,
               (this->asyncCallInfo)._M_t.
               super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               .
               super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
               ._M_head_impl);
    std::future<void>::get(&(local_28.data)->finalizeFuture);
    finalizeOperations(this);
    std::unique_lock<std::mutex>::~unique_lock(&local_28.m_handle_lock);
    return;
  }
  finalize(this);
  return;
}

Assistant:

void Federate::finalizeComplete()
{
    if (singleThreadFederate) {
        return finalize();
    }
    if (currentMode == Modes::PENDING_FINALIZE) {
        auto asyncInfo = asyncCallInfo->lock();
        asyncInfo->finalizeFuture.get();
        finalizeOperations();
    } else {
        finalize();
    }
}